

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall
IRT::CJumpConditionalStatement::CJumpConditionalStatement
          (CJumpConditionalStatement *this,TLogicOperator _operation,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *left,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *right,
          unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
          *_labelTrue,
          unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
          *_labelFalse)

{
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00181078;
  (this->leftOperand)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (left->_M_t).
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (left->_M_t).
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  (this->rightOperand)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (right->_M_t).
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (right->_M_t).
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  (this->labelTrue)._M_t.
  super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
  .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl =
       (_labelTrue->_M_t).
       super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
       .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl;
  (_labelTrue->_M_t).
  super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
  .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl = (CLabelStatement *)0x0;
  (this->labelFalse)._M_t.
  super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
  .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl =
       (_labelFalse->_M_t).
       super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
       .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl;
  (_labelFalse->_M_t).
  super___uniq_ptr_impl<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CLabelStatement_*,_std::default_delete<const_IRT::CLabelStatement>_>
  .super__Head_base<0UL,_const_IRT::CLabelStatement_*,_false>._M_head_impl = (CLabelStatement *)0x0;
  this->operation = _operation;
  return;
}

Assistant:

CJumpConditionalStatement::CJumpConditionalStatement( TLogicOperator _operation,
                                                      std::unique_ptr<const CExpression> left,
                                                      std::unique_ptr<const CExpression> right,
                                                      std::unique_ptr<const CLabelStatement> _labelTrue,
                                                      std::unique_ptr<const CLabelStatement> _labelFalse )
        : operation( _operation ),
          leftOperand( std::move( left )), rightOperand( std::move( right )),
          labelTrue( std::move( _labelTrue )), labelFalse( std::move( _labelFalse )) { }